

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolAccess.cpp
# Opt level: O0

int __thiscall bhf::ads::SymbolAccess::Read(SymbolAccess *this,string *name,ostream *os)

{
  bool bVar1;
  byte bVar2;
  short sVar3;
  unsigned_short uVar4;
  int iVar5;
  uint uVar6;
  pointer ppVar7;
  size_type length;
  uchar *puVar8;
  ostream *poVar9;
  void *pvVar10;
  short *value;
  int *value_00;
  float *value_01;
  double *value_02;
  byte *pbVar11;
  unsigned_short *value_03;
  uint *value_04;
  unsigned_long *value_05;
  unsigned_long uVar12;
  float fVar13;
  double dVar14;
  string local_620 [32];
  stringstream local_600 [8];
  stringstream stream_2;
  ostream local_5f0 [376];
  string local_478 [32];
  stringstream local_458 [8];
  stringstream stream_1;
  ostream local_448 [376];
  long local_2d0;
  long status;
  uint32_t bytesRead;
  vector<unsigned_char,_std::allocator<unsigned_char>_> readBuffer;
  SymbolEntry entry;
  string local_220 [32];
  stringstream local_200 [8];
  stringstream stream;
  ostream local_1f0 [376];
  _Self local_78 [3];
  _Self local_60;
  const_iterator it;
  SymbolEntryMap entries;
  ostream *os_local;
  string *name_local;
  SymbolAccess *this_local;
  
  FetchSymbolEntries_abi_cxx11_((SymbolEntryMap *)&it,this);
  local_60._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry>_>_>
       ::find((SymbolEntryMap *)&it,name);
  local_78[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry>_>_>
              *)&it);
  bVar1 = std::operator==(&local_60,local_78);
  if (bVar1) {
    std::__cxx11::stringstream::stringstream(local_200);
    poVar9 = std::operator<<(local_1f0,"Read");
    poVar9 = std::operator<<(poVar9,"(): symbol \'");
    poVar9 = std::operator<<(poVar9,(string *)name);
    std::operator<<(poVar9,"\' not found\n");
    std::__cxx11::stringstream::str();
    Logger::Log(2,local_220);
    std::__cxx11::string::~string((string *)local_220);
    std::__cxx11::stringstream::~stringstream(local_200);
    this_local._4_4_ = 0x710;
    entry._124_4_ = 1;
  }
  else {
    ppVar7 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry>_>
             ::operator->(&local_60);
    SymbolEntry::SymbolEntry
              ((SymbolEntry *)
               &readBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage,&ppVar7->second);
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)((long)&status + 7));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&bytesRead,
               (ulong)entry.header.iGroup,(allocator<unsigned_char> *)((long)&status + 7));
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)((long)&status + 7));
    status._0_4_ = 0;
    length = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&bytesRead);
    puVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&bytesRead);
    local_2d0 = AdsDevice::ReadReqEx2
                          (&this->device,
                           readBuffer.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage._4_4_,entry.header.entryLength
                           ,length,puVar8,(uint32_t *)&status);
    if (local_2d0 == 0) {
      switch(entry.header.iOffs) {
      case 2:
        pvVar10 = (void *)std::ostream::operator<<(os,std::dec);
        value = (short *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                    &bytesRead);
        sVar3 = letoh<short>(value);
        poVar9 = (ostream *)std::ostream::operator<<(pvVar10,sVar3);
        std::operator<<(poVar9,'\n');
        break;
      case 3:
        pvVar10 = (void *)std::ostream::operator<<(os,std::dec);
        value_00 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                     &bytesRead);
        iVar5 = letoh<int>(value_00);
        poVar9 = (ostream *)std::ostream::operator<<(pvVar10,iVar5);
        std::operator<<(poVar9,'\n');
        break;
      case 4:
        pvVar10 = (void *)std::ostream::operator<<(os,std::dec);
        value_01 = (float *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                       &bytesRead);
        fVar13 = letoh<float>(value_01);
        poVar9 = (ostream *)std::ostream::operator<<(pvVar10,fVar13);
        std::operator<<(poVar9,'\n');
        break;
      case 5:
        pvVar10 = (void *)std::ostream::operator<<(os,std::dec);
        value_02 = (double *)
                   std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&bytesRead);
        dVar14 = letoh<double>(value_02);
        poVar9 = (ostream *)std::ostream::operator<<(pvVar10,dVar14);
        std::operator<<(poVar9,'\n');
        break;
      default:
        std::__cxx11::stringstream::stringstream(local_600);
        poVar9 = std::operator<<(local_5f0,"Read");
        poVar9 = std::operator<<(poVar9,"() Unknown type \'");
        poVar9 = std::operator<<(poVar9,(string *)&entry.field_0x38);
        std::operator<<(poVar9,"\' output in binary\n");
        std::__cxx11::stringstream::str();
        Logger::Log(2,local_620);
        std::__cxx11::string::~string((string *)local_620);
        std::__cxx11::stringstream::~stringstream(local_600);
        puVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&bytesRead);
        std::ostream::write((char *)os,(long)puVar8);
        break;
      case 0x11:
      case 0x21:
        pvVar10 = (void *)std::ostream::operator<<(os,std::dec);
        pbVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&bytesRead);
        poVar9 = (ostream *)std::ostream::operator<<(pvVar10,(uint)*pbVar11);
        std::operator<<(poVar9,'\n');
        break;
      case 0x12:
        pvVar10 = (void *)std::ostream::operator<<(os,std::dec);
        value_03 = (unsigned_short *)
                   std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&bytesRead);
        uVar4 = letoh<unsigned_short>(value_03);
        poVar9 = (ostream *)std::ostream::operator<<(pvVar10,uVar4);
        std::operator<<(poVar9,'\n');
        break;
      case 0x13:
        pvVar10 = (void *)std::ostream::operator<<(os,std::dec);
        value_04 = (uint *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                      &bytesRead);
        uVar6 = letoh<unsigned_int>(value_04);
        poVar9 = (ostream *)std::ostream::operator<<(pvVar10,uVar6);
        std::operator<<(poVar9,'\n');
        break;
      case 0x15:
        pvVar10 = (void *)std::ostream::operator<<(os,std::dec);
        value_05 = (unsigned_long *)
                   std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&bytesRead);
        uVar12 = letoh<unsigned_long>(value_05);
        poVar9 = (ostream *)std::ostream::operator<<(pvVar10,uVar12);
        std::operator<<(poVar9,'\n');
      }
      bVar2 = std::ios::good();
      this_local._4_4_ = (uint)((bVar2 ^ 0xff) & 1);
    }
    else {
      std::__cxx11::stringstream::stringstream(local_458);
      poVar9 = std::operator<<(local_448,"Read");
      poVar9 = std::operator<<(poVar9,"(): failed with: 0x");
      pvVar10 = (void *)std::ostream::operator<<(poVar9,std::hex);
      poVar9 = (ostream *)std::ostream::operator<<(pvVar10,local_2d0);
      std::operator<<(poVar9,'\n');
      std::__cxx11::stringstream::str();
      Logger::Log(3,local_478);
      std::__cxx11::string::~string((string *)local_478);
      std::__cxx11::stringstream::~stringstream(local_458);
      this_local._4_4_ = (uint)local_2d0;
    }
    entry._124_4_ = 1;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&bytesRead);
    SymbolEntry::~SymbolEntry
              ((SymbolEntry *)
               &readBuffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage);
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry>_>_>
          *)&it);
  return this_local._4_4_;
}

Assistant:

int SymbolAccess::Read(const std::string& name, std::ostream& os) const
{
    const auto entries = FetchSymbolEntries();
    const auto it = entries.find(name);
    if (it == entries.end()) {
        LOG_WARN(__FUNCTION__ << "(): symbol '" << name << "' not found\n");
        return ADSERR_DEVICE_SYMBOLNOTFOUND;
    }

    const auto entry = it->second;
    std::vector<uint8_t> readBuffer(entry.header.size);
    uint32_t bytesRead = 0;
    const auto status = device.ReadReqEx2(entry.header.iGroup,
                                          entry.header.iOffs,
                                          readBuffer.size(),
                                          readBuffer.data(),
                                          &bytesRead);
    if (ADSERR_NOERR != status) {
        LOG_ERROR(__FUNCTION__ << "(): failed with: 0x" << std::hex << status << '\n');
        return status;
    }

    switch (entry.header.dataType) {
    case 0x2:     //INT
        os << std::dec << letoh(*reinterpret_cast<int16_t*>(readBuffer.data())) << '\n';
        break;

    case 0x3:     //DINT
        os << std::dec << letoh(*reinterpret_cast<int32_t*>(readBuffer.data())) << '\n';
        break;

    case 0x4:     //REAL
        os << std::dec << letoh(*reinterpret_cast<float*>(readBuffer.data())) << '\n';
        break;

    case 0x5:     //LREAL
        os << std::dec << letoh(*reinterpret_cast<double*>(readBuffer.data())) << '\n';
        break;

    case 0x11:     // BYTE
    case 0x21:     // BOOL
        os << std::dec << (int)readBuffer.data()[0] << '\n';
        break;

    case 0x12:     // WORD, UINT
        os << std::dec << letoh(*reinterpret_cast<uint16_t*>(readBuffer.data())) << '\n';
        break;

    case 0x13:     // DWORD, UDINT
        os << std::dec << letoh(*reinterpret_cast<uint32_t*>(readBuffer.data())) << '\n';
        break;

    case 0x15:     // LWORD, ULINT
        os << std::dec << letoh(*reinterpret_cast<uint64_t*>(readBuffer.data())) << '\n';
        break;

    default:
        LOG_WARN(__FUNCTION__ << "() Unknown type '" << entry.typeName << "' output in binary\n");
        os.write((const char*)readBuffer.data(), bytesRead);
        break;
    }

    return !std::cout.good();
}